

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O3

void __thiscall argo::unparser::unparse_array(unparser *this,json *j,int indent_level)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  type tVar4;
  writer *pwVar5;
  json_array *pjVar6;
  ulong uVar7;
  pointer puVar8;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  print_indent(this,indent_level);
  pwVar5 = operator<<(this->m_writer,'[');
  std::__cxx11::string::string((string *)&local_70,this->m_space,&local_71);
  pwVar5 = operator<<(pwVar5,&local_70);
  std::__cxx11::string::string((string *)&local_50,this->m_newline,&local_72);
  operator<<(pwVar5,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pjVar6 = json::get_array(j);
  puVar1 = (pjVar6->
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pjVar6->
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pjVar6 = json::get_array(j);
  puVar8 = (pjVar6->
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pjVar6->
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    uVar7 = (ulong)((long)puVar2 - (long)puVar1) >> 3;
    do {
      tVar4 = json::get_instance_type
                        ((puVar8->_M_t).
                         super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
      if (tVar4 != object_e) {
        tVar4 = json::get_instance_type
                          ((puVar8->_M_t).
                           super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                           super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                           super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
        if (tVar4 != array_e) {
          print_indent(this,this->m_indent_inc + indent_level);
        }
      }
      unparse(this,(puVar8->_M_t).
                   super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                   super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                   super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,
              this->m_indent_inc + indent_level);
      if (1 < (int)uVar7) {
        pwVar5 = operator<<(this->m_writer,',');
        std::__cxx11::string::string((string *)&local_70,this->m_space,(allocator *)&local_50);
        operator<<(pwVar5,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      pwVar5 = this->m_writer;
      std::__cxx11::string::string((string *)&local_70,this->m_newline,(allocator *)&local_50);
      operator<<(pwVar5,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      puVar8 = puVar8 + 1;
      uVar7 = (ulong)((int)uVar7 - 1);
    } while (puVar8 != puVar3);
  }
  print_indent(this,indent_level);
  pwVar5 = this->m_writer;
  std::__cxx11::string::string((string *)&local_70,this->m_space,(allocator *)&local_50);
  pwVar5 = operator<<(pwVar5,&local_70);
  operator<<(pwVar5,']');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void unparser::unparse_array(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '[' << m_space << m_newline;
    int n = j.get_array().size();
    for (const auto &i : j.get_array())
    {
        if (i->get_instance_type() != json::object_e &&
            i->get_instance_type() != json::array_e)
        {
            print_indent(indent_level + m_indent_inc);
        }
        unparse(*i, indent_level + m_indent_inc);
        if (n-- > 1)
        {
            m_writer << ',' << m_space;
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << ']';
}